

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

void __thiscall Fl_Tree::scrollbar_size(Fl_Tree *this,int size)

{
  Fl_Scrollbar *pFVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint local_24;
  int scrollsize;
  int size_local;
  Fl_Tree *this_local;
  
  this->_scrollbar_size = size;
  if (this->_scrollbar_size == 0) {
    local_24 = Fl::scrollbar_size();
  }
  else {
    local_24 = this->_scrollbar_size;
  }
  uVar2 = Fl_Widget::w((Fl_Widget *)this->_vscroll);
  if (uVar2 != local_24) {
    pFVar1 = this->_vscroll;
    iVar3 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = Fl_Widget::w((Fl_Widget *)this);
    uVar2 = Fl_Widget::h((Fl_Widget *)this);
    uVar5 = Fl_Widget::h((Fl_Widget *)this->_vscroll);
    (*(pFVar1->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[4])
              (pFVar1,(ulong)((iVar3 + iVar4) - local_24),(ulong)uVar2,(ulong)local_24,(ulong)uVar5)
    ;
  }
  return;
}

Assistant:

void Fl_Tree::scrollbar_size(int size) {
  _scrollbar_size = size;
  int scrollsize = _scrollbar_size ? _scrollbar_size : Fl::scrollbar_size();
  if ( _vscroll->w() != scrollsize ) {
    _vscroll->resize(x()+w()-scrollsize, h(), scrollsize, _vscroll->h());
  }
#if FLTK_ABI_VERSION >= 10303
  if ( _hscroll->h() != scrollsize ) {
    _hscroll->resize(x(), y()+h()-scrollsize, _hscroll->w(), scrollsize);
  }
  // Changing scrollbar size affects _tiw/_tih + may affect scrollbar visibility
  calc_dimensions();
#endif
}